

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alu.cpp
# Opt level: O3

void __thiscall ALCdevice::ProcessAmbiDecStablized(ALCdevice *this,size_t SamplesToDo)

{
  BFormatDec::processStablize
            ((this->AmbiDecoder)._M_t.
             super___uniq_ptr_impl<BFormatDec,_std::default_delete<BFormatDec>_>._M_t.
             super__Tuple_impl<0UL,_BFormatDec_*,_std::default_delete<BFormatDec>_>.
             super__Head_base<0UL,_BFormatDec_*,_false>._M_head_impl,(this->RealOut).Buffer,
             (this->Dry).Buffer.mData,(ulong)(this->RealOut).ChannelIndex._M_elems[0],
             (ulong)(this->RealOut).ChannelIndex._M_elems[1],
             (ulong)(this->RealOut).ChannelIndex._M_elems[2],SamplesToDo);
  return;
}

Assistant:

void ALCdevice::ProcessAmbiDecStablized(const size_t SamplesToDo)
{
    /* Decode with front image stablization. */
    const ALuint lidx{RealOut.ChannelIndex[FrontLeft]};
    const ALuint ridx{RealOut.ChannelIndex[FrontRight]};
    const ALuint cidx{RealOut.ChannelIndex[FrontCenter]};

    AmbiDecoder->processStablize(RealOut.Buffer, Dry.Buffer.data(), lidx, ridx, cidx,
        SamplesToDo);
}